

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O1

void __thiscall V2MPlayer::Play(V2MPlayer *this,uint32_t a_time)

{
  uint32_t *puVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((this->m_base).valid == true) && (this->m_samplerate != 0)) {
    (this->m_state).state = OFF;
    Reset(this);
    (this->m_base).valid = false;
    uVar6 = this->m_samplerate;
    uVar2 = this->m_tpc;
    uVar7 = 0;
    (this->m_state).state = PLAYING;
    (this->m_state).smpldelta = 0;
    (this->m_state).smplrem = 0;
    uVar4 = 0;
    uVar6 = (uint)(((ulong)uVar6 * (ulong)a_time) / (ulong)uVar2);
    if (uVar6 != 0) {
      uVar2 = 0;
      do {
        uVar7 = uVar2;
        Tick(this);
        uVar4 = 0xffffffff;
        if ((this->m_state).state == PLAYING) {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (ulong)((this->m_state).nexttime - (this->m_state).time) *
                         (ulong)(this->m_state).usecs;
          auVar3 = auVar3 / ZEXT416((this->m_base).timediv2);
          puVar1 = &(this->m_state).smplrem;
          uVar2 = *puVar1;
          uVar5 = auVar3._4_4_;
          *puVar1 = *puVar1 + uVar5;
          uVar4 = auVar3._0_4_;
          (this->m_state).smpldelta = uVar4;
          if (CARRY4(uVar2,uVar5)) {
            uVar4 = uVar4 + 1;
            goto LAB_00106f1a;
          }
        }
        else {
LAB_00106f1a:
          (this->m_state).smpldelta = uVar4;
        }
        uVar4 = (this->m_state).smpldelta;
      } while ((uVar4 + uVar7 < uVar6) && (uVar2 = uVar4 + uVar7, (this->m_state).state == PLAYING))
      ;
    }
    (this->m_state).cursmpl = uVar7;
    (this->m_state).smpldelta = (uVar7 - uVar6) + uVar4;
    this->m_fadeval = 1.0;
    this->m_fadedelta = 0.0;
    (this->m_base).valid = true;
  }
  return;
}

Assistant:

void V2MPlayer::Play(uint32_t a_time)
{
    if (!m_base.valid || !m_samplerate)
        return;

    Stop();
    Reset();

    m_base.valid = sFALSE;
    uint32_t destsmpl, cursmpl = 0;
    {
        destsmpl = ((uint64_t)a_time * m_samplerate) / m_tpc;
    }

    m_state.state = PlayerState::PLAYING;
    m_state.smpldelta = 0;
    m_state.smplrem = 0;
    while ((cursmpl + m_state.smpldelta) < destsmpl && m_state.state == PlayerState::PLAYING)
    {
        cursmpl += m_state.smpldelta;
        Tick();
        if (m_state.state == PlayerState::PLAYING) {
            m_state.smpldelta = 0;
            UpdateSampleDelta(m_state.nexttime, m_state.time, m_state.usecs, m_base.timediv2, &m_state.smplrem, &m_state.smpldelta);
        } else
            m_state.smpldelta = -1;
    }

    m_state.cursmpl    = cursmpl;
    m_state.smpldelta -= (destsmpl - cursmpl);
    m_fadeval    = 1.0f;
    m_fadedelta  = 0.0f;
    m_base.valid = sTRUE;
}